

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

void cppqc::detail::TupleGeneratorHelper_shrink<0,int>::
     appendShrinks<std::tuple<cppqc::Generator<int>>>
               (tuple<int> *shrinkInput,
               vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *shrinkOutput,
               tuple<cppqc::Generator<int>_> *generators)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *this;
  reference piVar2;
  __tuple_element_t<0UL,_tuple<int>_> *p_Var3;
  tuple<cppqc::Generator<int>_> *in_RDX;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *in_RSI;
  tuple<int> *in_RDI;
  tuple<int> copiedShrinkInput;
  int *localShrink;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range3;
  vector<int,_std::allocator<int>_> allLocalShrinks;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Generator<int> *in_stack_ffffffffffffff88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  undefined1 *local_38;
  undefined1 local_30 [24];
  tuple<cppqc::Generator<int>_> *local_18;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *local_10;
  tuple<int> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  this = (vector<int,_std::allocator<int>_> *)
         std::get<0ul,cppqc::Generator<int>>((tuple<cppqc::Generator<int>_> *)0x430af3);
  std::get<0ul,int>((tuple<int> *)0x430b05);
  Generator<int>::shrink
            (in_stack_ffffffffffffff88,
             (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_38 = local_30;
  local_40._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff78);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_40);
    in_stack_ffffffffffffff84 = *piVar2;
    p_Var3 = std::get<0ul,int>((tuple<int> *)0x430b8b);
    *p_Var3 = in_stack_ffffffffffffff84;
    std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::push_back
              ((vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (value_type *)in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_40);
  }
  TupleGeneratorHelper_shrink<-1,int>::appendShrinks<std::tuple<cppqc::Generator<int>>>
            (local_8,local_10,local_18);
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }